

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_5_method_postfix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode **ppPVar1;
  PVIPNode *n2;
  PVIPNode *n3;
  PVIPNode *pPVar2;
  
  ppPVar1 = G->val;
  pPVar2 = ppPVar1[-5];
  n2 = ppPVar1[-3];
  n3 = ppPVar1[-2];
  if (n3 == (PVIPNode *)0x0) {
    n3 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  pPVar2 = PVIP_node_new_children3(&G->data,PVIP_NODE_META_METHOD_CALL,pPVar2,n2,n3);
  G->ss = pPVar2;
  G->val[-5] = pPVar2;
  return;
}

Assistant:

YY_ACTION(void) yy_5_method_postfix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a G->val[-1]
#define f3 G->val[-2]
#define f2 G->val[-3]
#define k G->val[-4]
#define f1 G->val[-5]
  yyprintf((stderr, "do yy_5_method_postfix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
                yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_META_METHOD_CALL, f1, f2, MAYBE(f3));\n\
                f1=yy;\n\
            }\n"));
  
                yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_META_METHOD_CALL, f1, f2, MAYBE(f3));
                f1=yy;
            ;
#undef a
#undef f3
#undef f2
#undef k
#undef f1
}